

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_1,_false,_embree::avx::SubGridIntersector1Moeller<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined4 uVar57;
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  int iVar71;
  undefined4 uVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  uint uVar76;
  undefined4 uVar77;
  ulong uVar78;
  long lVar79;
  long lVar80;
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  ulong uVar89;
  ulong uVar90;
  float fVar91;
  float fVar99;
  float fVar100;
  vint4 ai_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  vint4 ai;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar123;
  float fVar124;
  vint4 ai_3;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar129;
  float fVar140;
  float fVar141;
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar165;
  uint uVar170;
  uint uVar172;
  float fVar173;
  uint uVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar169;
  float fVar171;
  float fVar175;
  uint uVar176;
  float fVar177;
  uint uVar178;
  float fVar179;
  uint uVar180;
  uint uVar181;
  undefined1 auVar168 [64];
  float fVar182;
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  float fVar191;
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_bf0;
  int local_bcc;
  ulong local_bc8;
  ulong local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  ulong local_ba8;
  ulong local_ba0;
  long local_b98;
  long local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  ulong local_b70;
  ulong local_b68;
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  long local_b48;
  float local_b40;
  float local_b3c;
  float local_b38;
  undefined4 local_b34;
  float local_b30;
  uint local_b2c;
  uint local_b28;
  uint local_b24;
  uint local_b20;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  uint uStack_864;
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar114 = ray->tfar;
    if (0.0 <= fVar114) {
      local_bf0 = local_800 + 1;
      aVar1 = (ray->dir).field_0;
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar1,auVar94);
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar152,1);
      auVar94 = vblendvps_avx((undefined1  [16])aVar1,auVar152,auVar94);
      auVar152 = vrcpps_avx(auVar94);
      fVar100 = auVar152._0_4_;
      auVar130._0_4_ = fVar100 * auVar94._0_4_;
      fVar101 = auVar152._4_4_;
      auVar130._4_4_ = fVar101 * auVar94._4_4_;
      fVar102 = auVar152._8_4_;
      auVar130._8_4_ = fVar102 * auVar94._8_4_;
      fVar104 = auVar152._12_4_;
      auVar130._12_4_ = fVar104 * auVar94._12_4_;
      auVar153._8_4_ = 0x3f800000;
      auVar153._0_8_ = 0x3f8000003f800000;
      auVar153._12_4_ = 0x3f800000;
      auVar94 = vsubps_avx(auVar153,auVar130);
      auVar131._0_4_ = fVar100 + fVar100 * auVar94._0_4_;
      auVar131._4_4_ = fVar101 + fVar101 * auVar94._4_4_;
      auVar131._8_4_ = fVar102 + fVar102 * auVar94._8_4_;
      auVar131._12_4_ = fVar104 + fVar104 * auVar94._12_4_;
      uVar72 = *(undefined4 *)&(ray->org).field_0;
      local_a60._4_4_ = uVar72;
      local_a60._0_4_ = uVar72;
      local_a60._8_4_ = uVar72;
      local_a60._12_4_ = uVar72;
      uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_9f0._4_4_ = uVar72;
      local_9f0._0_4_ = uVar72;
      local_9f0._8_4_ = uVar72;
      local_9f0._12_4_ = uVar72;
      auVar164 = ZEXT1664(local_9f0);
      uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_a00._4_4_ = uVar72;
      local_a00._0_4_ = uVar72;
      local_a00._8_4_ = uVar72;
      local_a00._12_4_ = uVar72;
      auVar168 = ZEXT1664(local_a00);
      local_a10 = vshufps_avx(auVar131,auVar131,0);
      auVar184 = ZEXT1664(local_a10);
      auVar94 = vmovshdup_avx(auVar131);
      local_a20 = vshufps_avx(auVar131,auVar131,0x55);
      auVar193 = ZEXT1664(local_a20);
      auVar152 = vshufpd_avx(auVar131,auVar131,1);
      local_a30 = vshufps_avx(auVar131,auVar131,0xaa);
      auVar201 = ZEXT1664(local_a30);
      uVar75 = (ulong)(auVar131._0_4_ < 0.0) << 4;
      uVar82 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x20;
      auVar158 = ZEXT1664(local_a60);
      uVar83 = (ulong)(auVar152._0_4_ < 0.0) << 4 | 0x40;
      uVar84 = uVar75 ^ 0x10;
      uVar86 = uVar82 ^ 0x10;
      uVar90 = uVar83 ^ 0x10;
      local_a40 = vshufps_avx(auVar92,auVar92,0);
      auVar203 = ZEXT1664(local_a40);
      local_a50 = vshufps_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),0);
      auVar205 = ZEXT1664(local_a50);
      local_ba0 = (ulong)(((uint)(auVar131._0_4_ < 0.0) << 4) >> 2);
      local_ba8 = uVar84 >> 2;
      local_bb0 = uVar82 >> 2;
      local_bb8 = uVar86 >> 2;
      local_bc0 = uVar83 >> 2;
      local_9e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_9e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_9a0 = vperm2f128_avx(local_9e0,mm_lookupmask_ps._0_32_,2);
      local_bc8 = uVar90 >> 2;
      auVar97._8_4_ = 0xbf800000;
      auVar97._0_8_ = 0xbf800000bf800000;
      auVar97._12_4_ = 0xbf800000;
      auVar97._16_4_ = 0xbf800000;
      auVar97._20_4_ = 0xbf800000;
      auVar97._24_4_ = 0xbf800000;
      auVar97._28_4_ = 0xbf800000;
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
      _local_9c0 = vblendvps_avx(auVar120,auVar97,local_9a0);
      local_b50 = uVar75;
      local_b58 = uVar82;
      local_b60 = uVar83;
      local_b68 = uVar84;
      local_b70 = uVar86;
      local_b78 = uVar90;
LAB_00b8dc3d:
      if (local_bf0 != local_800) {
        uVar89 = local_bf0[-1];
        local_bf0 = local_bf0 + -1;
        while ((uVar89 & 8) == 0) {
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar75),auVar158._0_16_);
          auVar92._0_4_ = auVar184._0_4_ * auVar94._0_4_;
          auVar92._4_4_ = auVar184._4_4_ * auVar94._4_4_;
          auVar92._8_4_ = auVar184._8_4_ * auVar94._8_4_;
          auVar92._12_4_ = auVar184._12_4_ * auVar94._12_4_;
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar82),auVar164._0_16_);
          auVar107._0_4_ = auVar193._0_4_ * auVar94._0_4_;
          auVar107._4_4_ = auVar193._4_4_ * auVar94._4_4_;
          auVar107._8_4_ = auVar193._8_4_ * auVar94._8_4_;
          auVar107._12_4_ = auVar193._12_4_ * auVar94._12_4_;
          auVar94 = vpmaxsd_avx(auVar92,auVar107);
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar83),auVar168._0_16_);
          auVar108._0_4_ = auVar201._0_4_ * auVar92._0_4_;
          auVar108._4_4_ = auVar201._4_4_ * auVar92._4_4_;
          auVar108._8_4_ = auVar201._8_4_ * auVar92._8_4_;
          auVar108._12_4_ = auVar201._12_4_ * auVar92._12_4_;
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar84),auVar158._0_16_);
          auVar115._0_4_ = auVar184._0_4_ * auVar92._0_4_;
          auVar115._4_4_ = auVar184._4_4_ * auVar92._4_4_;
          auVar115._8_4_ = auVar184._8_4_ * auVar92._8_4_;
          auVar115._12_4_ = auVar184._12_4_ * auVar92._12_4_;
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar86),auVar164._0_16_);
          auVar132._0_4_ = auVar193._0_4_ * auVar92._0_4_;
          auVar132._4_4_ = auVar193._4_4_ * auVar92._4_4_;
          auVar132._8_4_ = auVar193._8_4_ * auVar92._8_4_;
          auVar132._12_4_ = auVar193._12_4_ * auVar92._12_4_;
          auVar152 = vpminsd_avx(auVar115,auVar132);
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar89 + 0x20 + uVar90),auVar168._0_16_);
          auVar133._0_4_ = auVar201._0_4_ * auVar92._0_4_;
          auVar133._4_4_ = auVar201._4_4_ * auVar92._4_4_;
          auVar133._8_4_ = auVar201._8_4_ * auVar92._8_4_;
          auVar133._12_4_ = auVar201._12_4_ * auVar92._12_4_;
          auVar92 = vpmaxsd_avx(auVar108,auVar203._0_16_);
          auVar94 = vpmaxsd_avx(auVar94,auVar92);
          auVar92 = vpminsd_avx(auVar133,auVar205._0_16_);
          auVar92 = vpminsd_avx(auVar152,auVar92);
          auVar94 = vpcmpgtd_avx(auVar94,auVar92);
          iVar71 = vmovmskps_avx(auVar94);
          if (iVar71 == 0xf) goto LAB_00b8dc3d;
          bVar70 = (byte)iVar71 ^ 0xf;
          uVar73 = uVar89 & 0xfffffffffffffff0;
          lVar79 = 0;
          if (bVar70 != 0) {
            for (; (bVar70 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
            }
          }
          uVar89 = *(ulong *)(uVar73 + lVar79 * 8);
          uVar76 = bVar70 - 1 & (uint)bVar70;
          uVar78 = (ulong)uVar76;
          if (uVar76 != 0) {
            do {
              *local_bf0 = uVar89;
              local_bf0 = local_bf0 + 1;
              lVar79 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
                }
              }
              uVar89 = *(ulong *)(uVar73 + lVar79 * 8);
              uVar78 = uVar78 - 1 & uVar78;
            } while (uVar78 != 0);
          }
        }
        local_b98 = (ulong)((uint)uVar89 & 0xf) - 8;
        uVar89 = uVar89 & 0xfffffffffffffff0;
        for (local_b90 = 0; local_b90 != local_b98; local_b90 = local_b90 + 1) {
          lVar79 = local_b90 * 0x58;
          local_b48 = uVar89 + lVar79;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(uVar89 + 0x20 + lVar79);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)(uVar89 + 0x24 + lVar79);
          auVar92 = vpminub_avx(auVar93,auVar109);
          auVar94 = vpcmpeqb_avx(auVar93,auVar92);
          auVar92 = vpcmpeqd_avx(auVar92,auVar92);
          auVar94 = vpmovzxbd_avx(auVar94 ^ auVar92);
          auVar94 = vpslld_avx(auVar94 ^ auVar92,0x1f);
          uVar72 = vmovmskps_avx(auVar94);
          fVar114 = *(float *)(uVar89 + 0x38 + lVar79);
          fVar100 = *(float *)(uVar89 + 0x44 + lVar79);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(local_ba0 + 0x20 + local_b48);
          auVar94 = vpmovzxbd_avx(auVar116);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar117._0_4_ = fVar114 + fVar100 * auVar94._0_4_;
          auVar117._4_4_ = fVar114 + fVar100 * auVar94._4_4_;
          auVar117._8_4_ = fVar114 + fVar100 * auVar94._8_4_;
          auVar117._12_4_ = fVar114 + fVar100 * auVar94._12_4_;
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(local_ba8 + 0x20 + local_b48);
          auVar94 = vpmovzxbd_avx(auVar134);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar95._0_4_ = fVar114 + fVar100 * auVar94._0_4_;
          auVar95._4_4_ = fVar114 + fVar100 * auVar94._4_4_;
          auVar95._8_4_ = fVar114 + fVar100 * auVar94._8_4_;
          auVar95._12_4_ = fVar114 + fVar100 * auVar94._12_4_;
          fVar114 = *(float *)(uVar89 + 0x3c + lVar79);
          fVar100 = *(float *)(uVar89 + 0x48 + lVar79);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = *(ulong *)(local_bb0 + 0x20 + local_b48);
          auVar94 = vpmovzxbd_avx(auVar146);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar147._0_4_ = fVar114 + fVar100 * auVar94._0_4_;
          auVar147._4_4_ = fVar114 + fVar100 * auVar94._4_4_;
          auVar147._8_4_ = fVar114 + fVar100 * auVar94._8_4_;
          auVar147._12_4_ = fVar114 + fVar100 * auVar94._12_4_;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)(local_bb8 + 0x20 + local_b48);
          auVar94 = vpmovzxbd_avx(auVar154);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar110._0_4_ = fVar114 + fVar100 * auVar94._0_4_;
          auVar110._4_4_ = fVar114 + fVar100 * auVar94._4_4_;
          auVar110._8_4_ = fVar114 + fVar100 * auVar94._8_4_;
          auVar110._12_4_ = fVar114 + fVar100 * auVar94._12_4_;
          fVar114 = *(float *)(uVar89 + 0x4c + lVar79);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = *(ulong *)(local_bc0 + 0x20 + local_b48);
          auVar94 = vpmovzxbd_avx(auVar155);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = *(ulong *)(local_bc8 + 0x20 + local_b48);
          auVar92 = vpmovzxbd_avx(auVar159);
          auVar92 = vcvtdq2ps_avx(auVar92);
          fVar100 = *(float *)(uVar89 + 0x40 + lVar79);
          auVar156._0_4_ = fVar100 + fVar114 * auVar94._0_4_;
          auVar156._4_4_ = fVar100 + fVar114 * auVar94._4_4_;
          auVar156._8_4_ = fVar100 + fVar114 * auVar94._8_4_;
          auVar156._12_4_ = fVar100 + fVar114 * auVar94._12_4_;
          auVar135._0_4_ = fVar100 + fVar114 * auVar92._0_4_;
          auVar135._4_4_ = fVar100 + fVar114 * auVar92._4_4_;
          auVar135._8_4_ = fVar100 + fVar114 * auVar92._8_4_;
          auVar135._12_4_ = fVar100 + fVar114 * auVar92._12_4_;
          auVar94 = vsubps_avx(auVar117,auVar158._0_16_);
          auVar118._0_4_ = auVar184._0_4_ * auVar94._0_4_;
          auVar118._4_4_ = auVar184._4_4_ * auVar94._4_4_;
          auVar118._8_4_ = auVar184._8_4_ * auVar94._8_4_;
          auVar118._12_4_ = auVar184._12_4_ * auVar94._12_4_;
          auVar94 = vsubps_avx(auVar147,auVar164._0_16_);
          auVar148._0_4_ = auVar193._0_4_ * auVar94._0_4_;
          auVar148._4_4_ = auVar193._4_4_ * auVar94._4_4_;
          auVar148._8_4_ = auVar193._8_4_ * auVar94._8_4_;
          auVar148._12_4_ = auVar193._12_4_ * auVar94._12_4_;
          auVar94 = vpmaxsd_avx(auVar118,auVar148);
          auVar92 = vsubps_avx(auVar95,auVar158._0_16_);
          auVar96._0_4_ = auVar184._0_4_ * auVar92._0_4_;
          auVar96._4_4_ = auVar184._4_4_ * auVar92._4_4_;
          auVar96._8_4_ = auVar184._8_4_ * auVar92._8_4_;
          auVar96._12_4_ = auVar184._12_4_ * auVar92._12_4_;
          auVar92 = vsubps_avx(auVar110,auVar164._0_16_);
          auVar111._0_4_ = auVar193._0_4_ * auVar92._0_4_;
          auVar111._4_4_ = auVar193._4_4_ * auVar92._4_4_;
          auVar111._8_4_ = auVar193._8_4_ * auVar92._8_4_;
          auVar111._12_4_ = auVar193._12_4_ * auVar92._12_4_;
          auVar152 = vpminsd_avx(auVar96,auVar111);
          auVar92 = vsubps_avx(auVar156,auVar168._0_16_);
          auVar112._0_4_ = auVar201._0_4_ * auVar92._0_4_;
          auVar112._4_4_ = auVar201._4_4_ * auVar92._4_4_;
          auVar112._8_4_ = auVar201._8_4_ * auVar92._8_4_;
          auVar112._12_4_ = auVar201._12_4_ * auVar92._12_4_;
          auVar92 = vpmaxsd_avx(auVar112,auVar203._0_16_);
          auVar94 = vpmaxsd_avx(auVar94,auVar92);
          auVar92 = vsubps_avx(auVar135,auVar168._0_16_);
          auVar119._0_4_ = auVar201._0_4_ * auVar92._0_4_;
          auVar119._4_4_ = auVar201._4_4_ * auVar92._4_4_;
          auVar119._8_4_ = auVar201._8_4_ * auVar92._8_4_;
          auVar119._12_4_ = auVar201._12_4_ * auVar92._12_4_;
          auVar92 = vpminsd_avx(auVar119,auVar205._0_16_);
          auVar92 = vpminsd_avx(auVar152,auVar92);
          auVar94 = vpcmpgtd_avx(auVar94,auVar92);
          uVar77 = vmovmskps_avx(auVar94);
          for (uVar73 = (ulong)(byte)(~(byte)uVar77 & (byte)uVar72); uVar73 != 0;
              uVar73 = uVar73 & uVar73 - 1) {
            lVar79 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
              }
            }
            uVar3 = *(ushort *)(local_b48 + lVar79 * 8);
            uVar4 = *(ushort *)(local_b48 + 2 + lVar79 * 8);
            uVar76 = *(uint *)(local_b48 + 0x50);
            uVar5 = *(uint *)(local_b48 + 4 + lVar79 * 8);
            local_b80 = (ulong)uVar76;
            pGVar6 = (context->scene->geometries).items[uVar76].ptr;
            lVar79 = *(long *)&pGVar6->field_0x58;
            local_b88 = (ulong)uVar5;
            lVar80 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)uVar5;
            uVar85 = uVar3 & 0x7fff;
            uVar87 = uVar4 & 0x7fff;
            uVar81 = *(uint *)(lVar79 + 4 + lVar80);
            uVar83 = (ulong)uVar81;
            uVar82 = (ulong)(uVar81 * uVar87 + *(int *)(lVar79 + lVar80) + uVar85);
            p_Var7 = pGVar6[1].intersectionFilterN;
            lVar8 = *(long *)&pGVar6[1].time_range.upper;
            auVar94 = *(undefined1 (*) [16])(lVar8 + (long)p_Var7 * uVar82);
            auVar92 = *(undefined1 (*) [16])(lVar8 + (uVar82 + 1) * (long)p_Var7);
            auVar152 = *(undefined1 (*) [16])(lVar8 + (uVar82 + uVar83) * (long)p_Var7);
            lVar88 = uVar82 + uVar83 + 1;
            auVar130 = *(undefined1 (*) [16])(lVar8 + lVar88 * (long)p_Var7);
            uVar75 = (ulong)(-1 < (short)uVar3);
            auVar131 = *(undefined1 (*) [16])(lVar8 + (uVar82 + uVar75 + 1) * (long)p_Var7);
            lVar74 = uVar75 + lVar88;
            auVar153 = *(undefined1 (*) [16])(lVar8 + lVar74 * (long)p_Var7);
            uVar75 = 0;
            if (-1 < (short)uVar4) {
              uVar75 = uVar83;
            }
            auVar107 = *(undefined1 (*) [16])(lVar8 + (uVar82 + uVar83 + uVar75) * (long)p_Var7);
            auVar108 = *(undefined1 (*) [16])(lVar8 + (lVar88 + uVar75) * (long)p_Var7);
            auVar115 = *(undefined1 (*) [16])(lVar8 + (uVar75 + lVar74) * (long)p_Var7);
            auVar133 = vunpcklps_avx(auVar94,auVar130);
            auVar94 = vunpckhps_avx(auVar94,auVar130);
            auVar93 = vunpcklps_avx(auVar92,auVar152);
            auVar132 = vunpckhps_avx(auVar92,auVar152);
            auVar132 = vunpcklps_avx(auVar94,auVar132);
            auVar95 = vunpcklps_avx(auVar133,auVar93);
            auVar94 = vunpckhps_avx(auVar133,auVar93);
            auVar133 = vunpcklps_avx(auVar92,auVar153);
            auVar92 = vunpckhps_avx(auVar92,auVar153);
            auVar93 = vunpcklps_avx(auVar131,auVar130);
            auVar131 = vunpckhps_avx(auVar131,auVar130);
            auVar96 = vunpcklps_avx(auVar92,auVar131);
            auVar109 = vunpcklps_avx(auVar133,auVar93);
            auVar92 = vunpckhps_avx(auVar133,auVar93);
            auVar133 = vunpcklps_avx(auVar130,auVar115);
            auVar131 = vunpckhps_avx(auVar130,auVar115);
            auVar115 = vunpcklps_avx(auVar153,auVar108);
            auVar153 = vunpckhps_avx(auVar153,auVar108);
            auVar153 = vunpcklps_avx(auVar131,auVar153);
            auVar93 = vunpcklps_avx(auVar133,auVar115);
            auVar131 = vunpckhps_avx(auVar133,auVar115);
            auVar115 = vunpcklps_avx(auVar152,auVar108);
            auVar152 = vunpckhps_avx(auVar152,auVar108);
            auVar108 = vunpcklps_avx(auVar130,auVar107);
            auVar130 = vunpckhps_avx(auVar130,auVar107);
            auVar130 = vunpcklps_avx(auVar152,auVar130);
            auVar107 = vunpcklps_avx(auVar115,auVar108);
            auVar152 = vunpckhps_avx(auVar115,auVar108);
            auVar113._16_16_ = auVar93;
            auVar113._0_16_ = auVar95;
            auVar157._16_16_ = auVar131;
            auVar157._0_16_ = auVar94;
            auVar162._16_16_ = auVar153;
            auVar162._0_16_ = auVar132;
            auVar136._16_16_ = auVar109;
            auVar136._0_16_ = auVar109;
            auVar150._16_16_ = auVar92;
            auVar150._0_16_ = auVar92;
            auVar121._16_16_ = auVar96;
            auVar121._0_16_ = auVar96;
            auVar167._16_16_ = auVar107;
            auVar167._0_16_ = auVar107;
            auVar183._16_16_ = auVar152;
            auVar183._0_16_ = auVar152;
            auVar192._16_16_ = auVar130;
            auVar192._0_16_ = auVar130;
            local_a80 = vsubps_avx(auVar113,auVar136);
            local_aa0 = vsubps_avx(auVar157,auVar150);
            auVar97 = vsubps_avx(auVar162,auVar121);
            auVar120 = vsubps_avx(auVar167,auVar113);
            auVar98 = vsubps_avx(auVar183,auVar157);
            auVar121 = vsubps_avx(auVar192,auVar162);
            fVar102 = local_aa0._0_4_;
            fVar191 = auVar121._0_4_;
            fVar127 = local_aa0._4_4_;
            fVar194 = auVar121._4_4_;
            auVar53._4_4_ = fVar194 * fVar127;
            auVar53._0_4_ = fVar191 * fVar102;
            fVar91 = local_aa0._8_4_;
            fVar195 = auVar121._8_4_;
            auVar53._8_4_ = fVar195 * fVar91;
            fVar17 = local_aa0._12_4_;
            fVar196 = auVar121._12_4_;
            auVar53._12_4_ = fVar196 * fVar17;
            fVar26 = local_aa0._16_4_;
            fVar197 = auVar121._16_4_;
            auVar53._16_4_ = fVar197 * fVar26;
            fVar35 = local_aa0._20_4_;
            fVar198 = auVar121._20_4_;
            auVar53._20_4_ = fVar198 * fVar35;
            fVar44 = local_aa0._24_4_;
            fVar199 = auVar121._24_4_;
            auVar53._24_4_ = fVar199 * fVar44;
            auVar53._28_4_ = auVar96._12_4_;
            fVar104 = auVar97._0_4_;
            fVar182 = auVar98._0_4_;
            fVar128 = auVar97._4_4_;
            fVar185 = auVar98._4_4_;
            auVar54._4_4_ = fVar185 * fVar128;
            auVar54._0_4_ = fVar182 * fVar104;
            fVar99 = auVar97._8_4_;
            fVar186 = auVar98._8_4_;
            auVar54._8_4_ = fVar186 * fVar99;
            fVar18 = auVar97._12_4_;
            fVar187 = auVar98._12_4_;
            auVar54._12_4_ = fVar187 * fVar18;
            fVar27 = auVar97._16_4_;
            fVar188 = auVar98._16_4_;
            auVar54._16_4_ = fVar188 * fVar27;
            fVar36 = auVar97._20_4_;
            fVar189 = auVar98._20_4_;
            auVar54._20_4_ = fVar189 * fVar36;
            fVar45 = auVar97._24_4_;
            uVar57 = auVar109._12_4_;
            fVar190 = auVar98._24_4_;
            auVar54._24_4_ = fVar190 * fVar45;
            auVar54._28_4_ = uVar57;
            local_ac0 = vsubps_avx(auVar54,auVar53);
            fVar165 = auVar120._0_4_;
            fVar169 = auVar120._4_4_;
            auVar55._4_4_ = fVar169 * fVar128;
            auVar55._0_4_ = fVar165 * fVar104;
            fVar171 = auVar120._8_4_;
            auVar55._8_4_ = fVar171 * fVar99;
            fVar173 = auVar120._12_4_;
            auVar55._12_4_ = fVar173 * fVar18;
            fVar175 = auVar120._16_4_;
            auVar55._16_4_ = fVar175 * fVar27;
            fVar177 = auVar120._20_4_;
            auVar55._20_4_ = fVar177 * fVar36;
            fVar179 = auVar120._24_4_;
            auVar55._24_4_ = fVar179 * fVar45;
            auVar55._28_4_ = uVar57;
            fVar106 = local_a80._0_4_;
            fVar129 = local_a80._4_4_;
            auVar56._4_4_ = fVar194 * fVar129;
            auVar56._0_4_ = fVar191 * fVar106;
            fVar10 = local_a80._8_4_;
            auVar56._8_4_ = fVar195 * fVar10;
            fVar19 = local_a80._12_4_;
            auVar56._12_4_ = fVar196 * fVar19;
            fVar28 = local_a80._16_4_;
            auVar56._16_4_ = fVar197 * fVar28;
            fVar37 = local_a80._20_4_;
            auVar56._20_4_ = fVar198 * fVar37;
            fVar46 = local_a80._24_4_;
            fVar58 = auVar92._12_4_;
            auVar56._24_4_ = fVar199 * fVar46;
            auVar56._28_4_ = fVar58;
            auVar97 = vsubps_avx(auVar56,auVar55);
            auVar59._4_4_ = fVar185 * fVar129;
            auVar59._0_4_ = fVar182 * fVar106;
            auVar59._8_4_ = fVar186 * fVar10;
            auVar59._12_4_ = fVar187 * fVar19;
            auVar59._16_4_ = fVar188 * fVar28;
            auVar59._20_4_ = fVar189 * fVar37;
            auVar59._24_4_ = fVar190 * fVar46;
            auVar59._28_4_ = fVar58;
            auVar60._4_4_ = fVar169 * fVar127;
            auVar60._0_4_ = fVar165 * fVar102;
            auVar60._8_4_ = fVar171 * fVar91;
            auVar60._12_4_ = fVar173 * fVar17;
            auVar60._16_4_ = fVar175 * fVar26;
            auVar60._20_4_ = fVar177 * fVar35;
            auVar60._24_4_ = fVar179 * fVar44;
            auVar60._28_4_ = local_aa0._28_4_;
            local_ae0 = vsubps_avx(auVar60,auVar59);
            uVar72 = *(undefined4 *)&(ray->org).field_0;
            auVar200._4_4_ = uVar72;
            auVar200._0_4_ = uVar72;
            auVar200._8_4_ = uVar72;
            auVar200._12_4_ = uVar72;
            auVar200._16_4_ = uVar72;
            auVar200._20_4_ = uVar72;
            auVar200._24_4_ = uVar72;
            auVar200._28_4_ = uVar72;
            uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar202._4_4_ = uVar72;
            auVar202._0_4_ = uVar72;
            auVar202._8_4_ = uVar72;
            auVar202._12_4_ = uVar72;
            auVar202._16_4_ = uVar72;
            auVar202._20_4_ = uVar72;
            auVar202._24_4_ = uVar72;
            auVar202._28_4_ = uVar72;
            uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar204._4_4_ = uVar77;
            auVar204._0_4_ = uVar77;
            auVar204._8_4_ = uVar77;
            auVar204._12_4_ = uVar77;
            auVar204._16_4_ = uVar77;
            auVar204._20_4_ = uVar77;
            auVar204._24_4_ = uVar77;
            auVar204._28_4_ = uVar77;
            fVar114 = (ray->dir).field_0.m128[1];
            auVar53 = vsubps_avx(auVar113,auVar200);
            fVar100 = (ray->dir).field_0.m128[2];
            auVar54 = vsubps_avx(auVar157,auVar202);
            auVar55 = vsubps_avx(auVar162,auVar204);
            fVar103 = auVar55._0_4_;
            fVar140 = auVar55._4_4_;
            auVar61._4_4_ = fVar114 * fVar140;
            auVar61._0_4_ = fVar114 * fVar103;
            fVar11 = auVar55._8_4_;
            auVar61._8_4_ = fVar114 * fVar11;
            fVar20 = auVar55._12_4_;
            auVar61._12_4_ = fVar114 * fVar20;
            fVar29 = auVar55._16_4_;
            auVar61._16_4_ = fVar114 * fVar29;
            fVar38 = auVar55._20_4_;
            auVar61._20_4_ = fVar114 * fVar38;
            fVar47 = auVar55._24_4_;
            auVar61._24_4_ = fVar114 * fVar47;
            auVar61._28_4_ = uVar72;
            fVar105 = auVar54._0_4_;
            fVar141 = auVar54._4_4_;
            auVar62._4_4_ = fVar100 * fVar141;
            auVar62._0_4_ = fVar100 * fVar105;
            fVar12 = auVar54._8_4_;
            auVar62._8_4_ = fVar100 * fVar12;
            fVar21 = auVar54._12_4_;
            auVar62._12_4_ = fVar100 * fVar21;
            fVar30 = auVar54._16_4_;
            auVar62._16_4_ = fVar100 * fVar30;
            fVar39 = auVar54._20_4_;
            auVar62._20_4_ = fVar100 * fVar39;
            fVar48 = auVar54._24_4_;
            auVar62._24_4_ = fVar100 * fVar48;
            auVar62._28_4_ = uVar77;
            auVar54 = vsubps_avx(auVar62,auVar61);
            fVar101 = (ray->dir).field_0.m128[0];
            fVar123 = auVar53._0_4_;
            fVar142 = auVar53._4_4_;
            auVar63._4_4_ = fVar100 * fVar142;
            auVar63._0_4_ = fVar100 * fVar123;
            fVar13 = auVar53._8_4_;
            auVar63._8_4_ = fVar100 * fVar13;
            fVar22 = auVar53._12_4_;
            auVar63._12_4_ = fVar100 * fVar22;
            fVar31 = auVar53._16_4_;
            auVar63._16_4_ = fVar100 * fVar31;
            fVar40 = auVar53._20_4_;
            auVar63._20_4_ = fVar100 * fVar40;
            fVar49 = auVar53._24_4_;
            auVar63._24_4_ = fVar100 * fVar49;
            auVar63._28_4_ = local_ac0._28_4_;
            auVar64._4_4_ = fVar101 * fVar140;
            auVar64._0_4_ = fVar101 * fVar103;
            auVar64._8_4_ = fVar101 * fVar11;
            auVar64._12_4_ = fVar101 * fVar20;
            auVar64._16_4_ = fVar101 * fVar29;
            auVar64._20_4_ = fVar101 * fVar38;
            auVar64._24_4_ = fVar101 * fVar47;
            auVar64._28_4_ = uVar57;
            auVar55 = vsubps_avx(auVar64,auVar63);
            auVar65._4_4_ = fVar101 * fVar141;
            auVar65._0_4_ = fVar101 * fVar105;
            auVar65._8_4_ = fVar101 * fVar12;
            auVar65._12_4_ = fVar101 * fVar21;
            auVar65._16_4_ = fVar101 * fVar30;
            auVar65._20_4_ = fVar101 * fVar39;
            auVar65._24_4_ = fVar101 * fVar48;
            auVar65._28_4_ = uVar57;
            auVar66._4_4_ = fVar114 * fVar142;
            auVar66._0_4_ = fVar114 * fVar123;
            auVar66._8_4_ = fVar114 * fVar13;
            auVar66._12_4_ = fVar114 * fVar22;
            auVar66._16_4_ = fVar114 * fVar31;
            auVar66._20_4_ = fVar114 * fVar40;
            auVar66._24_4_ = fVar114 * fVar49;
            auVar66._28_4_ = fVar58;
            auVar56 = vsubps_avx(auVar66,auVar65);
            fVar124 = local_ae0._0_4_;
            fVar143 = local_ae0._4_4_;
            fVar14 = local_ae0._8_4_;
            fVar23 = local_ae0._12_4_;
            fVar32 = local_ae0._16_4_;
            fVar41 = local_ae0._20_4_;
            fVar50 = local_ae0._24_4_;
            fVar125 = auVar97._0_4_;
            fVar144 = auVar97._4_4_;
            fVar15 = auVar97._8_4_;
            fVar24 = auVar97._12_4_;
            fVar33 = auVar97._16_4_;
            fVar42 = auVar97._20_4_;
            fVar51 = auVar97._24_4_;
            fVar126 = local_ac0._0_4_;
            fVar145 = local_ac0._4_4_;
            fVar16 = local_ac0._8_4_;
            fVar25 = local_ac0._12_4_;
            fVar34 = local_ac0._16_4_;
            fVar43 = local_ac0._20_4_;
            fVar52 = local_ac0._24_4_;
            auVar151._0_4_ = fVar101 * fVar126 + fVar114 * fVar125 + fVar100 * fVar124;
            auVar151._4_4_ = fVar101 * fVar145 + fVar114 * fVar144 + fVar100 * fVar143;
            auVar151._8_4_ = fVar101 * fVar16 + fVar114 * fVar15 + fVar100 * fVar14;
            auVar151._12_4_ = fVar101 * fVar25 + fVar114 * fVar24 + fVar100 * fVar23;
            auVar151._16_4_ = fVar101 * fVar34 + fVar114 * fVar33 + fVar100 * fVar32;
            auVar151._20_4_ = fVar101 * fVar43 + fVar114 * fVar42 + fVar100 * fVar41;
            auVar151._24_4_ = fVar101 * fVar52 + fVar114 * fVar51 + fVar100 * fVar50;
            auVar151._28_4_ = fVar100 + fVar100 + fVar58;
            auVar137._8_4_ = 0x80000000;
            auVar137._0_8_ = 0x8000000080000000;
            auVar137._12_4_ = 0x80000000;
            auVar137._16_4_ = 0x80000000;
            auVar137._20_4_ = 0x80000000;
            auVar137._24_4_ = 0x80000000;
            auVar137._28_4_ = 0x80000000;
            auVar97 = vandps_avx(auVar151,auVar137);
            uVar81 = auVar97._0_4_;
            auVar160._0_4_ =
                 (float)(uVar81 ^ (uint)(fVar165 * auVar54._0_4_ +
                                        fVar182 * auVar55._0_4_ + fVar191 * auVar56._0_4_));
            uVar170 = auVar97._4_4_;
            auVar160._4_4_ =
                 (float)(uVar170 ^
                        (uint)(fVar169 * auVar54._4_4_ +
                              fVar185 * auVar55._4_4_ + fVar194 * auVar56._4_4_));
            uVar172 = auVar97._8_4_;
            auVar160._8_4_ =
                 (float)(uVar172 ^
                        (uint)(fVar171 * auVar54._8_4_ +
                              fVar186 * auVar55._8_4_ + fVar195 * auVar56._8_4_));
            uVar174 = auVar97._12_4_;
            auVar160._12_4_ =
                 (float)(uVar174 ^
                        (uint)(fVar173 * auVar54._12_4_ +
                              fVar187 * auVar55._12_4_ + fVar196 * auVar56._12_4_));
            uVar176 = auVar97._16_4_;
            auVar160._16_4_ =
                 (float)(uVar176 ^
                        (uint)(fVar175 * auVar54._16_4_ +
                              fVar188 * auVar55._16_4_ + fVar197 * auVar56._16_4_));
            uVar178 = auVar97._20_4_;
            auVar160._20_4_ =
                 (float)(uVar178 ^
                        (uint)(fVar177 * auVar54._20_4_ +
                              fVar189 * auVar55._20_4_ + fVar198 * auVar56._20_4_));
            uVar180 = auVar97._24_4_;
            auVar160._24_4_ =
                 (float)(uVar180 ^
                        (uint)(fVar179 * auVar54._24_4_ +
                              fVar190 * auVar55._24_4_ + fVar199 * auVar56._24_4_));
            uVar181 = auVar97._28_4_;
            auVar160._28_4_ =
                 (float)(uVar181 ^ (uint)(auVar120._28_4_ + auVar98._28_4_ + auVar121._28_4_));
            auVar163._0_4_ =
                 (float)(uVar81 ^ (uint)(auVar54._0_4_ * fVar106 +
                                        auVar55._0_4_ * fVar102 + fVar104 * auVar56._0_4_));
            auVar163._4_4_ =
                 (float)(uVar170 ^
                        (uint)(auVar54._4_4_ * fVar129 +
                              auVar55._4_4_ * fVar127 + fVar128 * auVar56._4_4_));
            auVar163._8_4_ =
                 (float)(uVar172 ^
                        (uint)(auVar54._8_4_ * fVar10 +
                              auVar55._8_4_ * fVar91 + fVar99 * auVar56._8_4_));
            auVar163._12_4_ =
                 (float)(uVar174 ^
                        (uint)(auVar54._12_4_ * fVar19 +
                              auVar55._12_4_ * fVar17 + fVar18 * auVar56._12_4_));
            auVar163._16_4_ =
                 (float)(uVar176 ^
                        (uint)(auVar54._16_4_ * fVar28 +
                              auVar55._16_4_ * fVar26 + fVar27 * auVar56._16_4_));
            auVar163._20_4_ =
                 (float)(uVar178 ^
                        (uint)(auVar54._20_4_ * fVar37 +
                              auVar55._20_4_ * fVar35 + fVar36 * auVar56._20_4_));
            auVar163._24_4_ =
                 (float)(uVar180 ^
                        (uint)(auVar54._24_4_ * fVar46 +
                              auVar55._24_4_ * fVar44 + fVar45 * auVar56._24_4_));
            auVar163._28_4_ =
                 (float)(uVar181 ^ (uint)(local_ac0._28_4_ + auVar55._28_4_ + auVar56._28_4_));
            auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar97 = vcmpps_avx(auVar160,auVar120,5);
            auVar120 = vcmpps_avx(auVar163,auVar120,5);
            auVar97 = vandps_avx(auVar97,auVar120);
            auVar98._8_4_ = 0x7fffffff;
            auVar98._0_8_ = 0x7fffffff7fffffff;
            auVar98._12_4_ = 0x7fffffff;
            auVar98._16_4_ = 0x7fffffff;
            auVar98._20_4_ = 0x7fffffff;
            auVar98._24_4_ = 0x7fffffff;
            auVar98._28_4_ = 0x7fffffff;
            local_920 = vandps_avx(auVar151,auVar98);
            auVar120 = vcmpps_avx(auVar151,ZEXT1232(ZEXT812(0)) << 0x20,4);
            auVar97 = vandps_avx(auVar97,auVar120);
            auVar138._0_4_ = auVar163._0_4_ + auVar160._0_4_;
            auVar138._4_4_ = auVar163._4_4_ + auVar160._4_4_;
            auVar138._8_4_ = auVar163._8_4_ + auVar160._8_4_;
            auVar138._12_4_ = auVar163._12_4_ + auVar160._12_4_;
            auVar138._16_4_ = auVar163._16_4_ + auVar160._16_4_;
            auVar138._20_4_ = auVar163._20_4_ + auVar160._20_4_;
            auVar138._24_4_ = auVar163._24_4_ + auVar160._24_4_;
            auVar138._28_4_ = auVar163._28_4_ + auVar160._28_4_;
            auVar98 = vcmpps_avx(auVar138,local_920,2);
            auVar120 = vandps_avx(auVar97,auVar98);
            auVar121 = local_9e0 & auVar120;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar120 = vandps_avx(auVar120,local_9e0);
              local_940._0_4_ =
                   (float)(uVar81 ^ (uint)(fVar126 * fVar123 + fVar125 * fVar105 + fVar103 * fVar124
                                          ));
              local_940._4_4_ =
                   (float)(uVar170 ^
                          (uint)(fVar145 * fVar142 + fVar144 * fVar141 + fVar140 * fVar143));
              local_940._8_4_ =
                   (float)(uVar172 ^ (uint)(fVar16 * fVar13 + fVar15 * fVar12 + fVar11 * fVar14));
              local_940._12_4_ =
                   (float)(uVar174 ^ (uint)(fVar25 * fVar22 + fVar24 * fVar21 + fVar20 * fVar23));
              local_940._16_4_ =
                   (float)(uVar176 ^ (uint)(fVar34 * fVar31 + fVar33 * fVar30 + fVar29 * fVar32));
              local_940._20_4_ =
                   (float)(uVar178 ^ (uint)(fVar43 * fVar40 + fVar42 * fVar39 + fVar38 * fVar41));
              local_940._24_4_ =
                   (float)(uVar180 ^ (uint)(fVar52 * fVar49 + fVar51 * fVar48 + fVar47 * fVar50));
              local_940._28_4_ = uVar181 ^ (uint)(auVar53._28_4_ + auVar98._28_4_ + auVar97._28_4_);
              fVar114 = (ray->org).field_0.m128[3];
              fVar100 = local_920._0_4_;
              fVar101 = local_920._4_4_;
              auVar67._4_4_ = fVar101 * fVar114;
              auVar67._0_4_ = fVar100 * fVar114;
              fVar102 = local_920._8_4_;
              auVar67._8_4_ = fVar102 * fVar114;
              fVar104 = local_920._12_4_;
              auVar67._12_4_ = fVar104 * fVar114;
              fVar106 = local_920._16_4_;
              auVar67._16_4_ = fVar106 * fVar114;
              fVar103 = local_920._20_4_;
              auVar67._20_4_ = fVar103 * fVar114;
              fVar105 = local_920._24_4_;
              auVar67._24_4_ = fVar105 * fVar114;
              auVar67._28_4_ = fVar114;
              auVar97 = vcmpps_avx(auVar67,local_940,1);
              fVar114 = ray->tfar;
              auVar68._4_4_ = fVar101 * fVar114;
              auVar68._0_4_ = fVar100 * fVar114;
              auVar68._8_4_ = fVar102 * fVar114;
              auVar68._12_4_ = fVar104 * fVar114;
              auVar68._16_4_ = fVar106 * fVar114;
              auVar68._20_4_ = fVar103 * fVar114;
              auVar68._24_4_ = fVar105 * fVar114;
              auVar68._28_4_ = fVar114;
              auVar98 = vcmpps_avx(local_940,auVar68,2);
              auVar97 = vandps_avx(auVar98,auVar97);
              auVar98 = auVar120 & auVar97;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar2._0_4_ = ray->tfar;
                auVar2._4_4_ = ray->mask;
                auVar2._8_4_ = ray->id;
                auVar2._12_4_ = ray->flags;
                local_8e0 = vandps_avx(auVar120,auVar97);
                uVar81 = vextractps_avx(auVar2,1);
                auVar97 = vsubps_avx(local_920,auVar163);
                auVar97 = vblendvps_avx(auVar160,auVar97,local_9a0);
                auVar98 = vsubps_avx(local_920,auVar160);
                auVar120 = vblendvps_avx(auVar163,auVar98,local_9a0);
                uStack_844 = auVar98._28_4_;
                local_860[0] = fVar126 * (float)local_9c0._0_4_;
                local_860[1] = fVar145 * (float)local_9c0._4_4_;
                local_860[2] = fVar16 * fStack_9b8;
                local_860[3] = fVar25 * fStack_9b4;
                fStack_850 = fVar34 * fStack_9b0;
                fStack_84c = fVar43 * fStack_9ac;
                fStack_848 = fVar52 * fStack_9a8;
                local_840[0] = fVar125 * (float)local_9c0._0_4_;
                local_840[1] = fVar144 * (float)local_9c0._4_4_;
                local_840[2] = fVar15 * fStack_9b8;
                local_840[3] = fVar24 * fStack_9b4;
                fStack_830 = fVar33 * fStack_9b0;
                fStack_82c = fVar42 * fStack_9ac;
                fStack_828 = fVar51 * fStack_9a8;
                uStack_824 = uStack_844;
                local_820[0] = (float)local_9c0._0_4_ * fVar124;
                local_820[1] = (float)local_9c0._4_4_ * fVar143;
                local_820[2] = fStack_9b8 * fVar14;
                local_820[3] = fStack_9b4 * fVar23;
                fStack_810 = fStack_9b0 * fVar32;
                fStack_80c = fStack_9ac * fVar41;
                fStack_808 = fStack_9a8 * fVar50;
                uStack_804 = uStack_844;
                auVar94 = vpshufd_avx(ZEXT416(uVar85),0);
                auVar94 = vpaddd_avx(auVar94,_DAT_01f76ad0);
                auVar92 = vpshufd_avx(ZEXT416(uVar87),0);
                auVar149._0_4_ = (float)(int)(*(ushort *)(lVar79 + 8 + lVar80) - 1);
                auVar149._4_12_ = auVar54._4_12_;
                auVar92 = vpaddd_avx(auVar92,_DAT_01f76ae0);
                auVar152 = vrcpss_avx(auVar149,auVar149);
                auVar166._0_4_ = (float)(int)(*(ushort *)(lVar79 + 10 + lVar80) - 1);
                auVar166._4_12_ = auVar54._4_12_;
                auVar130 = vrcpss_avx(auVar166,auVar166);
                auVar122._16_16_ = auVar94;
                auVar122._0_16_ = auVar94;
                auVar98 = vcvtdq2ps_avx(auVar122);
                auVar94 = ZEXT416((uint)(auVar152._0_4_ * (2.0 - auVar152._0_4_ * auVar149._0_4_)));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                fVar114 = (fVar100 * auVar98._0_4_ + auVar97._0_4_) * auVar94._0_4_;
                fVar123 = (fVar101 * auVar98._4_4_ + auVar97._4_4_) * auVar94._4_4_;
                local_980._4_4_ = fVar123;
                local_980._0_4_ = fVar114;
                fVar124 = (fVar102 * auVar98._8_4_ + auVar97._8_4_) * auVar94._8_4_;
                local_980._8_4_ = fVar124;
                fVar125 = (fVar104 * auVar98._12_4_ + auVar97._12_4_) * auVar94._12_4_;
                local_980._12_4_ = fVar125;
                fVar126 = (fVar106 * auVar98._16_4_ + auVar97._16_4_) * auVar94._0_4_;
                local_980._16_4_ = fVar126;
                fVar127 = (fVar103 * auVar98._20_4_ + auVar97._20_4_) * auVar94._4_4_;
                local_980._20_4_ = fVar127;
                fVar128 = (fVar105 * auVar98._24_4_ + auVar97._24_4_) * auVar94._8_4_;
                local_980._24_4_ = fVar128;
                local_980._28_4_ = auVar98._28_4_ + auVar97._28_4_;
                auVar139._16_16_ = auVar92;
                auVar139._0_16_ = auVar92;
                auVar97 = vcvtdq2ps_avx(auVar139);
                auVar94 = ZEXT416((uint)(auVar130._0_4_ * (2.0 - auVar130._0_4_ * auVar166._0_4_)));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                fVar129 = (fVar100 * auVar97._0_4_ + auVar120._0_4_) * auVar94._0_4_;
                fVar140 = (fVar101 * auVar97._4_4_ + auVar120._4_4_) * auVar94._4_4_;
                local_960._4_4_ = fVar140;
                local_960._0_4_ = fVar129;
                fVar141 = (fVar102 * auVar97._8_4_ + auVar120._8_4_) * auVar94._8_4_;
                local_960._8_4_ = fVar141;
                fVar142 = (fVar104 * auVar97._12_4_ + auVar120._12_4_) * auVar94._12_4_;
                local_960._12_4_ = fVar142;
                fVar143 = (fVar106 * auVar97._16_4_ + auVar120._16_4_) * auVar94._0_4_;
                local_960._16_4_ = fVar143;
                fVar144 = (fVar103 * auVar97._20_4_ + auVar120._20_4_) * auVar94._4_4_;
                local_960._20_4_ = fVar144;
                fVar145 = (fVar105 * auVar97._24_4_ + auVar120._24_4_) * auVar94._8_4_;
                local_960._24_4_ = fVar145;
                local_960._28_4_ = auVar97._28_4_ + auVar120._28_4_;
                if ((pGVar6->mask & uVar81) != 0) {
                  pRVar9 = context->args;
                  if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00b8e6ac:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_ae0._0_8_ = pGVar6;
                  auVar97 = vrcpps_avx(local_920);
                  fVar91 = auVar97._0_4_;
                  fVar99 = auVar97._4_4_;
                  auVar69._4_4_ = fVar101 * fVar99;
                  auVar69._0_4_ = fVar100 * fVar91;
                  fVar100 = auVar97._8_4_;
                  auVar69._8_4_ = fVar102 * fVar100;
                  fVar101 = auVar97._12_4_;
                  auVar69._12_4_ = fVar104 * fVar101;
                  fVar102 = auVar97._16_4_;
                  auVar69._16_4_ = fVar106 * fVar102;
                  fVar104 = auVar97._20_4_;
                  auVar69._20_4_ = fVar103 * fVar104;
                  fVar106 = auVar97._24_4_;
                  auVar69._24_4_ = fVar105 * fVar106;
                  auVar69._28_4_ = local_920._28_4_;
                  auVar161._8_4_ = 0x3f800000;
                  auVar161._0_8_ = 0x3f8000003f800000;
                  auVar161._12_4_ = 0x3f800000;
                  auVar161._16_4_ = 0x3f800000;
                  auVar161._20_4_ = 0x3f800000;
                  auVar161._24_4_ = 0x3f800000;
                  auVar161._28_4_ = 0x3f800000;
                  auVar120 = vsubps_avx(auVar161,auVar69);
                  fVar91 = fVar91 + fVar91 * auVar120._0_4_;
                  fVar99 = fVar99 + fVar99 * auVar120._4_4_;
                  fVar100 = fVar100 + fVar100 * auVar120._8_4_;
                  fVar101 = fVar101 + fVar101 * auVar120._12_4_;
                  fVar102 = fVar102 + fVar102 * auVar120._16_4_;
                  fVar104 = fVar104 + fVar104 * auVar120._20_4_;
                  fVar106 = fVar106 + fVar106 * auVar120._24_4_;
                  local_880[0] = fVar91 * local_940._0_4_;
                  local_880[1] = fVar99 * local_940._4_4_;
                  local_880[2] = fVar100 * local_940._8_4_;
                  local_880[3] = fVar101 * local_940._12_4_;
                  fStack_870 = fVar102 * local_940._16_4_;
                  fStack_86c = fVar104 * local_940._20_4_;
                  fStack_868 = fVar106 * local_940._24_4_;
                  uStack_864 = local_940._28_4_;
                  local_8c0._4_4_ = fVar123 * fVar99;
                  local_8c0._0_4_ = fVar114 * fVar91;
                  local_8c0._8_4_ = fVar124 * fVar100;
                  local_8c0._12_4_ = fVar125 * fVar101;
                  local_8c0._16_4_ = fVar126 * fVar102;
                  local_8c0._20_4_ = fVar127 * fVar104;
                  local_8c0._24_4_ = fVar128 * fVar106;
                  local_8c0._28_4_ = local_940._28_4_;
                  local_8a0._4_4_ = fVar140 * fVar99;
                  local_8a0._0_4_ = fVar129 * fVar91;
                  local_8a0._8_4_ = fVar141 * fVar100;
                  local_8a0._12_4_ = fVar142 * fVar101;
                  local_8a0._16_4_ = fVar143 * fVar102;
                  local_8a0._20_4_ = fVar144 * fVar104;
                  local_8a0._24_4_ = fVar145 * fVar106;
                  local_8a0._28_4_ = auVar97._28_4_ + auVar120._28_4_;
                  uVar72 = vmovmskps_avx(local_8e0);
                  uVar75 = CONCAT44((int)((ulong)context >> 0x20),uVar72);
                  lVar79 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
                    }
                  }
                  while( true ) {
                    local_a80._0_8_ = uVar75;
                    if (uVar75 == 0) break;
                    local_b34 = *(undefined4 *)(local_8c0 + lVar79 * 4);
                    local_b30 = local_880[lVar79 + -8];
                    local_ac0._0_4_ = ray->tfar;
                    ray->tfar = local_880[lVar79];
                    local_b10.context = context->user;
                    local_b40 = local_860[lVar79];
                    local_b3c = local_840[lVar79];
                    local_aa0._0_8_ = lVar79;
                    local_b38 = local_820[lVar79];
                    local_b24 = (local_b10.context)->instID[0];
                    local_b20 = (local_b10.context)->instPrimID[0];
                    local_bcc = -1;
                    local_b10.valid = &local_bcc;
                    local_b10.geometryUserPtr = *(void **)(local_ae0._0_8_ + 0x18);
                    local_b10.hit = (RTCHitN *)&local_b40;
                    local_b10.N = 1;
                    local_b2c = uVar5;
                    local_b28 = uVar76;
                    local_b10.ray = (RTCRayN *)ray;
                    if (((*(code **)(local_ae0._0_8_ + 0x48) == (code *)0x0) ||
                        ((**(code **)(local_ae0._0_8_ + 0x48))(&local_b10), *local_b10.valid != 0))
                       && ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             ((*(byte *)(local_ae0._0_8_ + 0x3e) & 0x40) == 0)) ||
                            ((*pRVar9->filter)(&local_b10), *local_b10.valid != 0))))))
                    goto LAB_00b8e6ac;
                    ray->tfar = (float)local_ac0._0_4_;
                    uVar75 = local_a80._0_8_ ^ 1L << (local_aa0._0_8_ & 0x3f);
                    lVar79 = 0;
                    if (uVar75 != 0) {
                      for (; (uVar75 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
                      }
                    }
                  }
                }
              }
            }
            auVar164 = ZEXT1664(local_9f0);
            auVar168 = ZEXT1664(local_a00);
            auVar184 = ZEXT1664(local_a10);
            auVar193 = ZEXT1664(local_a20);
            auVar201 = ZEXT1664(local_a30);
            auVar203 = ZEXT1664(local_a40);
            auVar205 = ZEXT1664(local_a50);
            uVar75 = local_b50;
            uVar82 = local_b58;
            uVar83 = local_b60;
            uVar84 = local_b68;
            uVar86 = local_b70;
            uVar90 = local_b78;
          }
          auVar158 = ZEXT1664(local_a60);
        }
        goto LAB_00b8dc3d;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }